

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_opaque_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InlineOpaquePass::HasOpaqueArgsOrReturn(InlineOpaquePass *this,Instruction *callInst)

{
  pointer pOVar1;
  uint **ppuVar2;
  bool bVar3;
  char cVar4;
  uint32_t typeId;
  uint **ppuVar5;
  bool bVar6;
  pointer pOVar7;
  int icnt;
  undefined4 *local_50;
  InlineOpaquePass *local_48;
  code *local_40;
  code *local_38;
  uint *local_30;
  undefined4 local_24;
  
  typeId = 0;
  if (callInst->has_type_id_ == true) {
    typeId = Instruction::GetSingleWordOperand(callInst,0);
  }
  bVar3 = IsOpaqueType(this,typeId);
  bVar6 = true;
  if (!bVar3) {
    local_50 = &local_24;
    local_24 = 0;
    local_38 = std::
               _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_opaque_pass.cpp:54:35)>
               ::_M_invoke;
    local_40 = std::
               _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_opaque_pass.cpp:54:35)>
               ::_M_manager;
    pOVar7 = (callInst->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pOVar1 = (callInst->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_48 = this;
    if (pOVar7 == pOVar1) {
      bVar6 = false;
    }
    else {
      do {
        bVar3 = spvIsInIdType(pOVar7->type);
        if (bVar3) {
          ppuVar2 = (uint **)(pOVar7->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar5 = &(pOVar7->words).small_data_;
          if (ppuVar2 != (uint **)0x0) {
            ppuVar5 = ppuVar2;
          }
          local_30 = *ppuVar5;
          if (local_40 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          cVar4 = (*local_38)(&local_50,&local_30);
          if (cVar4 == '\0') {
            bVar6 = true;
            goto LAB_0021beac;
          }
        }
        pOVar7 = pOVar7 + 1;
      } while (pOVar7 != pOVar1);
      bVar6 = false;
LAB_0021beac:
      if (local_40 == (code *)0x0) {
        return bVar6;
      }
    }
    (*local_40)(&local_50,&local_50,3);
  }
  return bVar6;
}

Assistant:

bool InlineOpaquePass::HasOpaqueArgsOrReturn(const Instruction* callInst) {
  // Check return type
  if (IsOpaqueType(callInst->type_id())) return true;
  // Check args
  int icnt = 0;
  return !callInst->WhileEachInId([&icnt, this](const uint32_t* iid) {
    if (icnt > 0) {
      const Instruction* argInst = get_def_use_mgr()->GetDef(*iid);
      if (IsOpaqueType(argInst->type_id())) return false;
    }
    ++icnt;
    return true;
  });
}